

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O1

RK_S32 mpi_enc_opt_atf(void *ctx,char *next)

{
  uint uVar1;
  RK_S32 RVar2;
  
  if (next == (char *)0x0) {
    RVar2 = 0;
    _mpp_log_l(2,"mpi_enc_utils","invalid cu_qp_delta_depth\n",0);
  }
  else {
    uVar1 = atoi(next);
    if (uVar1 < 4) {
      *(uint *)((long)ctx + 0xb4) = uVar1;
      *(uint *)((long)ctx + 0xb8) = uVar1;
    }
    else {
      *(undefined8 *)((long)ctx + 0xb4) = 0;
      _mpp_log_l(2,"mpi_enc_utils","invalid atf_str %d set to default 0\n",0,uVar1);
    }
    RVar2 = 1;
  }
  return RVar2;
}

Assistant:

RK_S32 mpi_enc_opt_atf(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        RK_S32 val = atoi(next);

        if (val >= 0 && val <= 3 ) {
            cmd->anti_flicker_str = val;
            cmd->atf_str = val;
        } else {
            cmd->anti_flicker_str = 0;
            cmd->atf_str = 0;
            mpp_err("invalid atf_str %d set to default 0\n", val);
        }
        return 1;
    }

    mpp_err("invalid cu_qp_delta_depth\n");
    return 0;
}